

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decompress(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
                        size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *this;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  uint local_3c;
  size_t sStack_38;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  buffersize = 0;
  sStack_38 = 0;
  buffer = (uchar *)settings;
  settings_local = (LodePNGDecompressSettings *)insize;
  insize_local = (size_t)in;
  in_local = (uchar *)out;
  local_3c = zlib_decompress((uchar **)&buffersize,&stack0xffffffffffffffc8,in,insize,settings);
  this = in_local;
  if (buffersize != 0) {
    local_50._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_local);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_48,&local_50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_48,
               (uchar *)buffersize,(uchar *)(buffersize + sStack_38));
    lodepng_free((void *)buffersize);
  }
  return local_3c;
}

Assistant:

unsigned decompress(std::vector<unsigned char>& out, const unsigned char* in, size_t insize,
                    const LodePNGDecompressSettings& settings)
{
  unsigned char* buffer = 0;
  size_t buffersize = 0;
  unsigned error = zlib_decompress(&buffer, &buffersize, in, insize, &settings);
  if(buffer)
  {
    out.insert(out.end(), &buffer[0], &buffer[buffersize]);
    lodepng_free(buffer);
  }
  return error;
}